

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O0

SourceResultType __thiscall
duckdb::PipelineExecutor::FetchFromSource(PipelineExecutor *this,DataChunk *result)

{
  DataChunk *in_RSI;
  optional_ptr<duckdb::DataChunk,_true> in_RDI;
  SourceResultType res;
  OperatorSourceInput source_input;
  LocalSourceState *in_stack_000000b0;
  GlobalSourceState *in_stack_000000b8;
  OperatorProfiler *in_stack_000000c0;
  ThreadContext *in_stack_ffffffffffffffb0;
  PipelineExecutor *in_stack_ffffffffffffffb8;
  optional_ptr<duckdb::DataChunk,_true> local_38;
  SourceResultType local_29;
  PhysicalOperator *in_stack_ffffffffffffffd8;
  PipelineExecutor *in_stack_ffffffffffffffe0;
  
  optional_ptr<duckdb::PhysicalOperator,_true>::operator*
            ((optional_ptr<duckdb::PhysicalOperator,_true> *)in_stack_ffffffffffffffb0);
  StartOperator(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>::
  operator*((unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             *)in_stack_ffffffffffffffb0);
  unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>::
  operator*((unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
             *)in_stack_ffffffffffffffb0);
  local_29 = GetData((PipelineExecutor *)in_RDI.ptr,(DataChunk *)in_stack_ffffffffffffffb8,
                     (OperatorSourceInput *)in_stack_ffffffffffffffb0);
  if (local_29 == FINISHED) {
    in_stack_ffffffffffffffb0 = (((PipelineExecutor *)in_RDI.ptr)->context).thread;
    in_stack_ffffffffffffffb8 =
         (PipelineExecutor *)
         unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
         ::operator*((unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
                      *)in_stack_ffffffffffffffb0);
    unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>::
    operator*((unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
               *)in_stack_ffffffffffffffb0);
    OperatorProfiler::FinishSource(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  }
  optional_ptr<duckdb::PhysicalOperator,_true>::operator*
            ((optional_ptr<duckdb::PhysicalOperator,_true> *)in_stack_ffffffffffffffb0);
  optional_ptr<duckdb::DataChunk,_true>::optional_ptr(&local_38,in_RSI);
  EndOperator(in_stack_ffffffffffffffb8,(PhysicalOperator *)in_stack_ffffffffffffffb0,in_RDI);
  return local_29;
}

Assistant:

SourceResultType PipelineExecutor::FetchFromSource(DataChunk &result) {
	StartOperator(*pipeline.source);

	OperatorSourceInput source_input = {*pipeline.source_state, *local_source_state, interrupt_state};
	auto res = GetData(result, source_input);

	// Ensures sources only return empty results when Blocking or Finished
	D_ASSERT(res != SourceResultType::BLOCKED || result.size() == 0);
	if (res == SourceResultType::FINISHED) {
		// final call into the source - finish source execution
		context.thread.profiler.FinishSource(*pipeline.source_state, *local_source_state);
	}
	EndOperator(*pipeline.source, &result);

	return res;
}